

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O1

Symbol * __thiscall
slang::ast::PackageSymbol::findForImport(PackageSymbol *this,string_view lookupName)

{
  char *pcVar1;
  group_type_pointer pgVar2;
  SymbolKind SVar3;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  long lVar4;
  WildcardImportData *pWVar5;
  group_type_pointer pgVar6;
  value_type_pointer ppVar7;
  ExplicitImportSymbol *pEVar8;
  size_t sVar9;
  pointer ppPVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  char *pcVar18;
  int iVar19;
  uint64_t uVar20;
  size_t sVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  value_type_pointer ppVar27;
  ExplicitImportSymbol *pEVar28;
  long lVar29;
  ExplicitImportSymbol *unaff_R14;
  string_view *psVar30;
  ExplicitImportSymbol *pEVar31;
  bool bVar32;
  char cVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  string_view sVar36;
  ulong local_78;
  string_view lookupName_local;
  
  lookupName_local._M_str = lookupName._M_str;
  lookupName_local._M_len = lookupName._M_len;
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&this->super_Scope);
  }
  this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
            (this->super_Scope).nameMap;
  uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     (this_00,&lookupName_local);
  pcVar18 = lookupName_local._M_str;
  sVar9 = lookupName_local._M_len;
  uVar24 = uVar20 >> ((byte)*this_00 & 0x3f);
  lVar4 = *(long *)(this_00 + 0x10);
  lVar25 = (uVar20 & 0xff) * 4;
  cVar33 = (&UNK_0049b57c)[lVar25];
  cVar11 = (&UNK_0049b57d)[lVar25];
  cVar12 = (&UNK_0049b57e)[lVar25];
  cVar13 = (&UNK_0049b57f)[lVar25];
  uVar26 = 0;
  do {
    pcVar1 = (char *)(lVar4 + uVar24 * 0x10);
    auVar34[0] = -(*pcVar1 == cVar33);
    auVar34[1] = -(pcVar1[1] == cVar11);
    auVar34[2] = -(pcVar1[2] == cVar12);
    auVar34[3] = -(pcVar1[3] == cVar13);
    auVar34[4] = -(pcVar1[4] == cVar33);
    auVar34[5] = -(pcVar1[5] == cVar11);
    auVar34[6] = -(pcVar1[6] == cVar12);
    auVar34[7] = -(pcVar1[7] == cVar13);
    auVar34[8] = -(pcVar1[8] == cVar33);
    auVar34[9] = -(pcVar1[9] == cVar11);
    auVar34[10] = -(pcVar1[10] == cVar12);
    auVar34[0xb] = -(pcVar1[0xb] == cVar13);
    auVar34[0xc] = -(pcVar1[0xc] == cVar33);
    auVar34[0xd] = -(pcVar1[0xd] == cVar11);
    auVar34[0xe] = -(pcVar1[0xe] == cVar12);
    auVar34[0xf] = -(pcVar1[0xf] == cVar13);
    uVar23 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
    if (uVar23 != 0) {
      unaff_R14 = (ExplicitImportSymbol *)(ulong)uVar23;
      lVar25 = *(long *)(this_00 + 0x18) + uVar24 * 0x168;
      do {
        uVar23 = 0;
        uVar22 = (uint)unaff_R14;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        bVar32 = sVar9 == *(size_t *)(lVar25 + (ulong)uVar23 * 0x18);
        lVar29 = lVar25 + (ulong)uVar23 * 0x18;
        if (bVar32 && sVar9 != 0) {
          iVar19 = bcmp(pcVar18,*(void **)(lVar29 + 8),sVar9);
          bVar32 = iVar19 == 0;
        }
        if (bVar32) goto LAB_0014f3e7;
        uVar22 = uVar22 - 1 & uVar22;
        unaff_R14 = (ExplicitImportSymbol *)(ulong)uVar22;
      } while (uVar22 != 0);
    }
    if ((*(byte *)(uVar24 * 0x10 + lVar4 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7]) == 0) break;
    lVar25 = uVar24 + uVar26;
    uVar26 = uVar26 + 1;
    uVar24 = lVar25 + 1U & *(ulong *)(this_00 + 8);
  } while (uVar26 <= *(ulong *)(this_00 + 8));
  lVar29 = 0;
LAB_0014f3e7:
  if (lVar29 != 0) {
    psVar30 = (string_view *)(lVar29 + 0x10);
    while( true ) {
      unaff_R14 = (ExplicitImportSymbol *)psVar30->_M_len;
      SVar3 = (unaff_R14->super_Symbol).kind;
      if (SVar3 != TransparentMember) break;
      psVar30 = &unaff_R14->packageName;
    }
    if (SVar3 == ForwardingTypedef) {
      unaff_R14 = (ExplicitImportSymbol *)0x0;
    }
    else if (SVar3 == ExplicitImport) {
      unaff_R14 = (ExplicitImportSymbol *)ExplicitImportSymbol::importedSymbol(unaff_R14);
    }
  }
  if (lVar29 == 0) {
    pWVar5 = (this->super_Scope).importData;
    if ((pWVar5 != (WildcardImportData *)0x0) &&
       ((this->hasExportAll != false || ((this->exportDecls)._M_extent._M_extent_value != 0)))) {
      if (pWVar5->hasForceElaborated == false) {
        pWVar5->hasForceElaborated = true;
        Compilation::forceElaborate((this->super_Scope).compilation,&this->super_Symbol);
      }
      uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &pWVar5->importedSymbols,&lookupName_local);
      pcVar18 = lookupName_local._M_str;
      sVar9 = lookupName_local._M_len;
      uVar24 = uVar20 >> ((byte)(pWVar5->importedSymbols).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar6 = (pWVar5->importedSymbols).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_;
      lVar25 = (uVar20 & 0xff) * 4;
      uVar14 = (&UNK_0049b57c)[lVar25];
      uVar15 = (&UNK_0049b57d)[lVar25];
      uVar16 = (&UNK_0049b57e)[lVar25];
      uVar17 = (&UNK_0049b57f)[lVar25];
      local_78 = 0;
      do {
        pgVar2 = pgVar6 + uVar24;
        auVar35[0] = -(pgVar2->m[0].n == uVar14);
        auVar35[1] = -(pgVar2->m[1].n == uVar15);
        auVar35[2] = -(pgVar2->m[2].n == uVar16);
        auVar35[3] = -(pgVar2->m[3].n == uVar17);
        auVar35[4] = -(pgVar2->m[4].n == uVar14);
        auVar35[5] = -(pgVar2->m[5].n == uVar15);
        auVar35[6] = -(pgVar2->m[6].n == uVar16);
        auVar35[7] = -(pgVar2->m[7].n == uVar17);
        auVar35[8] = -(pgVar2->m[8].n == uVar14);
        auVar35[9] = -(pgVar2->m[9].n == uVar15);
        auVar35[10] = -(pgVar2->m[10].n == uVar16);
        auVar35[0xb] = -(pgVar2->m[0xb].n == uVar17);
        auVar35[0xc] = -(pgVar2->m[0xc].n == uVar14);
        auVar35[0xd] = -(pgVar2->m[0xd].n == uVar15);
        auVar35[0xe] = -(pgVar2->m[0xe].n == uVar16);
        auVar35[0xf] = -(pgVar2->m[0xf].n == uVar17);
        uVar23 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
        if (uVar23 != 0) {
          ppVar7 = (pWVar5->importedSymbols).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                   .arrays.elements_;
          do {
            uVar22 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            bVar32 = sVar9 == ppVar7[uVar24 * 0xf + (ulong)uVar22].first._M_len;
            ppVar27 = ppVar7 + uVar24 * 0xf + (ulong)uVar22;
            if (bVar32 && sVar9 != 0) {
              iVar19 = bcmp(pcVar18,(ppVar27->first)._M_str,sVar9);
              bVar32 = iVar19 == 0;
            }
            if (bVar32) goto LAB_0014f5e3;
            uVar23 = uVar23 - 1 & uVar23;
          } while (uVar23 != 0);
        }
        if ((pgVar6[uVar24].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7]) == 0) break;
        uVar26 = (pWVar5->importedSymbols).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                 .arrays.groups_size_mask;
        lVar25 = uVar24 + local_78;
        local_78 = local_78 + 1;
        uVar24 = lVar25 + 1U & uVar26;
      } while (local_78 <= uVar26);
      ppVar27 = (value_type_pointer)0x0;
LAB_0014f5e3:
      if (ppVar27 != (value_type_pointer)0x0) {
        pEVar8 = (ExplicitImportSymbol *)ppVar27->second;
        pEVar28 = pEVar8;
        if (this->hasExportAll != false) {
          return &pEVar8->super_Symbol;
        }
        do {
          pEVar28 = (ExplicitImportSymbol *)((pEVar28->super_Symbol).parentScope)->thisSym;
        } while ((pEVar28->super_Symbol).kind != Package);
        sVar9 = (this->exportDecls)._M_extent._M_extent_value;
        cVar33 = '\t';
        if (sVar9 != 0) {
          ppPVar10 = (this->exportDecls)._M_ptr;
          lVar25 = 0;
          pEVar31 = unaff_R14;
          do {
            lVar4 = *(long *)((long)ppPVar10 + lVar25);
            sVar36 = parsing::Token::valueText((Token *)(lVar4 + 0x18));
            sVar21 = sVar36._M_len;
            if ((sVar21 == (pEVar28->super_Symbol).name._M_len) &&
               ((sVar21 == 0 ||
                (iVar19 = bcmp(sVar36._M_str,(pEVar28->super_Symbol).name._M_str,sVar21),
                iVar19 == 0)))) {
              cVar33 = '\x01';
              unaff_R14 = pEVar8;
              if (*(short *)(lVar4 + 0x38) != 0x1b) {
                sVar36 = parsing::Token::valueText((Token *)(lVar4 + 0x38));
                sVar21 = sVar36._M_len;
                if (sVar21 == (pEVar8->super_Symbol).name._M_len) {
                  if (sVar21 == 0) {
                    cVar33 = true;
                  }
                  else {
                    iVar19 = bcmp(sVar36._M_str,(pEVar8->super_Symbol).name._M_str,sVar21);
                    cVar33 = iVar19 == 0;
                  }
                }
                else {
                  cVar33 = false;
                }
                unaff_R14 = pEVar31;
                if ((bool)cVar33 != false) {
                  unaff_R14 = pEVar8;
                }
              }
            }
            else {
              cVar33 = '\n';
              unaff_R14 = pEVar31;
            }
            if ((cVar33 != '\n') && (cVar33 != '\0')) goto LAB_0014f6e4;
            lVar25 = lVar25 + 8;
            pEVar31 = unaff_R14;
          } while (sVar9 << 3 != lVar25);
          cVar33 = '\t';
        }
LAB_0014f6e4:
        if (cVar33 == '\0') {
          unaff_R14 = (ExplicitImportSymbol *)0x0;
        }
        if (cVar33 != '\t') {
          return &unaff_R14->super_Symbol;
        }
        return &((ExplicitImportSymbol *)0x0)->super_Symbol;
      }
    }
    unaff_R14 = (ExplicitImportSymbol *)0x0;
  }
  return &unaff_R14->super_Symbol;
}

Assistant:

const Symbol* PackageSymbol::findForImport(std::string_view lookupName) const {
    auto& scopeNameMap = getNameMap();
    if (auto it = scopeNameMap.find(lookupName); it != scopeNameMap.end()) {
        auto symbol = it->second;
        while (symbol->kind == SymbolKind::TransparentMember)
            symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

        switch (symbol->kind) {
            case SymbolKind::ExplicitImport:
                return symbol->as<ExplicitImportSymbol>().importedSymbol();
            case SymbolKind::ForwardingTypedef:
                return nullptr;
            default:
                return symbol;
        }
    }

    auto wildcardData = getWildcardImportData();
    if (!wildcardData || (!hasExportAll && exportDecls.empty()))
        return nullptr;

    // We need to force-elaborate the entire package body because any
    // lookups that result in a wildcard import could add to our export list.
    if (!wildcardData->hasForceElaborated) {
        wildcardData->hasForceElaborated = true;
        getCompilation().forceElaborate(*this);
    }

    // Look through symbols that have been wildcard imported with this name.
    if (auto it = wildcardData->importedSymbols.find(lookupName);
        it != wildcardData->importedSymbols.end()) {

        auto symbol = it->second;
        if (hasExportAll)
            return symbol;

        // If we don't have an export-all directive then we need to check
        // whether we wanted to actually export this symbol.
        // First find the package that owns the target symbol.
        const Symbol* packageParent;
        auto targetScope = symbol->getParentScope();
        while (true) {
            SLANG_ASSERT(targetScope);
            packageParent = &targetScope->asSymbol();
            if (packageParent->kind == SymbolKind::Package)
                break;

            targetScope = packageParent->getParentScope();
        }

        // Now look for a matching export.
        for (auto decl : exportDecls) {
            if (decl->package.valueText() != packageParent->name)
                continue;

            if (decl->item.kind == TokenKind::Star || decl->item.valueText() == symbol->name)
                return symbol;
        }
    }

    return nullptr;
}